

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseName(char *in,char *end,Name **name)

{
  Name *this;
  Text *local_40;
  Text *id;
  Name *currentName;
  Name **ppNStack_28;
  NameType ntype;
  Name **name_local;
  char *end_local;
  char *in_local;
  
  *name = (Name *)0x0;
  in_local = in;
  if (((in != (char *)0x0) && (in != end)) &&
     ((ppNStack_28 = name, name_local = (Name **)end, end_local = in,
      in_local = lookForNextToken<char>(in,end), *in_local == '$' || (*in_local == '%')))) {
    currentName._4_4_ = (NameType)(*in_local == '%');
    end_local = in_local + 1;
    id = (Text *)0x0;
    local_40 = (Text *)0x0;
    end_local = parseIdentifier(end_local,(char *)name_local,&local_40);
    if (local_40 != (Text *)0x0) {
      this = (Name *)operator_new(0x10);
      Name::Name(this,currentName._4_4_,local_40);
      if (this != (Name *)0x0) {
        *ppNStack_28 = this;
      }
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseName( char *in, char *end, Name **name ) {
    *name = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );
    if( *in != '$' && *in != '%' ) {
        return in;
    }

    NameType ntype( GlobalName );
    if( *in == '%' ) {
        ntype = LocalName;
    }
    in++;
    Name *currentName( ddl_nullptr );
    Text *id( ddl_nullptr );
    in = parseIdentifier( in, end, &id );
    if( id ) {
        currentName = new Name( ntype, id );
        if( currentName ) {
            *name = currentName;
        }
    }

    return in;
}